

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::GetPsbtGlobal
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt *psbt,bool *is_find)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  wally_map *map_object;
  Transaction *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffdf0;
  CfdException *this;
  CfdException *except;
  string local_1c8;
  size_t local_1a8;
  size_t index;
  Serializer builder;
  string local_170 [32];
  CfdSourceLocation local_150;
  undefined4 local_134;
  ByteData local_130;
  undefined1 local_118 [8];
  Transaction tx;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  byte local_91;
  undefined1 local_90 [7];
  bool has_key_1byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  allocator local_61;
  string local_60 [32];
  CfdSourceLocation local_40;
  bool *local_28;
  bool *is_find_local;
  wally_psbt *psbt_local;
  ByteData *key_data_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffde8 >> 0x20);
  local_28 = is_find;
  is_find_local = (bool *)psbt;
  psbt_local = (wally_psbt *)key_data;
  key_data_local = __return_storage_ptr__;
  if (psbt == (wally_psbt *)0x0) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0x3a5;
    local_40.funcname = "GetPsbtGlobal";
    logger::warn<>(&local_40,"psbt pointer is null");
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_60,"psbt pointer is null.",&local_61);
    CfdException::CfdException(in_stack_fffffffffffffdf0,error_code,in_stack_fffffffffffffde0);
    key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,key_data);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
  local_91 = sVar2 == 1;
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,0);
  if (*pvVar3 == '\0') {
    if ((local_91 & 1) == 0) {
      local_b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_b0.filename = local_b0.filename + 1;
      local_b0.line = 0x3ad;
      local_b0.funcname = "GetPsbtGlobal";
      logger::warn<>(&local_b0,"psbt invalid key format.");
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      uVar1 = __cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_d0,"psbt invalid key format error.",
                 (allocator *)
                 ((long)&tx.vout_.
                         super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      CfdException::CfdException(in_stack_fffffffffffffdf0,error_code,in_stack_fffffffffffffde0);
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_28 != (bool *)0x0) {
      *local_28 = true;
    }
    ConvertBitcoinTxFromWally(&local_130,*(wally_tx **)(is_find_local + 8),false);
    Transaction::Transaction((Transaction *)local_118,&local_130);
    ByteData::~ByteData((ByteData *)0x480495);
    AbstractTransaction::GetData(__return_storage_ptr__,(AbstractTransaction *)local_118);
    local_134 = 1;
    Transaction::~Transaction(in_stack_fffffffffffffdd0);
  }
  else {
    pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,0);
    if (*pvVar3 == 0xfb) {
      if ((local_91 & 1) == 0) {
        local_150.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_150.filename = local_150.filename + 1;
        local_150.line = 0x3b6;
        local_150.funcname = "GetPsbtGlobal";
        logger::warn<>(&local_150,"psbt invalid key format.");
        builder._38_1_ = 1;
        uVar1 = __cxa_allocate_exception(0x30);
        this = (CfdException *)&builder.field_0x27;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_170,"psbt invalid key format error.",(allocator *)this)
        ;
        CfdException::CfdException(this,(CfdError)((ulong)uVar1 >> 0x20),in_stack_fffffffffffffde0);
        builder._38_1_ = 0;
        __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_28 != (bool *)0x0) {
        *local_28 = true;
      }
      Serializer::Serializer((Serializer *)&index);
      Serializer::AddDirectNumber((Serializer *)&index,*(uint32_t *)(is_find_local + 0x58));
      Serializer::Output(__return_storage_ptr__,(Serializer *)&index);
      local_134 = 1;
      Serializer::~Serializer((Serializer *)&index);
    }
    else {
      local_1a8 = 0;
      map_object = (wally_map *)(is_find_local + 0x40);
      in_stack_fffffffffffffde0 = (string *)((long)&except + 7);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_1c8,"global unknowns",(allocator *)in_stack_fffffffffffffde0);
      FindPsbtMap(map_object,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,
                  &local_1c8,&local_1a8);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&except + 7));
      if (local_28 != (bool *)0x0) {
        *local_28 = true;
      }
      ByteData::ByteData(__return_storage_ptr__,
                         *(uint8_t **)(*(long *)(is_find_local + 0x40) + 0x10 + local_1a8 * 0x20),
                         *(uint32_t *)(*(long *)(is_find_local + 0x40) + 0x18 + local_1a8 * 0x20));
      local_134 = 1;
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffde0);
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtGlobal(
    const ByteData &key_data, struct wally_psbt *psbt, bool *is_find) {
  if (psbt == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }
  if (is_find != nullptr) *is_find = false;
  const auto key = key_data.GetBytes();
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtGlobalUnsignedTx) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (is_find != nullptr) *is_find = true;
    Transaction tx(ConvertBitcoinTxFromWally(psbt->tx, false));
    return tx.GetData();
  } else if (key[0] == Psbt::kPsbtGlobalVersion) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (is_find != nullptr) *is_find = true;
    // TODO(k-matsuzawa) need endian support.
    Serializer builder;
    builder.AddDirectNumber(psbt->version);
    return builder.Output();
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&psbt->unknowns, key, "global unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          psbt->unknowns.items[index].value,
          static_cast<uint32_t>(psbt->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}